

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QTimeZonePrivate * newBackendTimeZone(void)

{
  QTzTimeZonePrivate *this;
  
  this = (QTzTimeZonePrivate *)operator_new(0x98);
  QTzTimeZonePrivate::QTzTimeZonePrivate(this);
  return &this->super_QTimeZonePrivate;
}

Assistant:

static QTimeZonePrivate *newBackendTimeZone()
{
#if QT_CONFIG(timezone_tzdb)
    return new QChronoTimeZonePrivate();
#elif defined(Q_OS_DARWIN)
    return new QMacTimeZonePrivate();
#elif defined(Q_OS_ANDROID)
    return new QAndroidTimeZonePrivate();
#elif defined(Q_OS_UNIX)
    return new QTzTimeZonePrivate();
#elif QT_CONFIG(icu)
    return new QIcuTimeZonePrivate();
#elif defined(Q_OS_WIN)
    return new QWinTimeZonePrivate();
#else
    return new QUtcTimeZonePrivate();
#endif // Backend selection
}